

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int mbedtls_cipher_cmac_reset(mbedtls_cipher_context_t *ctx)

{
  mbedtls_cmac_context_t *buf;
  mbedtls_cmac_context_t *cmac_ctx;
  mbedtls_cipher_context_t *ctx_local;
  
  if (((ctx == (mbedtls_cipher_context_t *)0x0) ||
      (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)) ||
     (ctx->cmac_ctx == (mbedtls_cmac_context_t *)0x0)) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    buf = ctx->cmac_ctx;
    buf->unprocessed_len = 0;
    mbedtls_platform_zeroize(buf->unprocessed_block,0x10);
    mbedtls_platform_zeroize(buf,0x10);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_cmac_reset(mbedtls_cipher_context_t *ctx)
{
    mbedtls_cmac_context_t *cmac_ctx;

    if (ctx == NULL || ctx->cipher_info == NULL || ctx->cmac_ctx == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cmac_ctx = ctx->cmac_ctx;

    /* Reset the internal state */
    cmac_ctx->unprocessed_len = 0;
    mbedtls_platform_zeroize(cmac_ctx->unprocessed_block,
                             sizeof(cmac_ctx->unprocessed_block));
    mbedtls_platform_zeroize(cmac_ctx->state,
                             sizeof(cmac_ctx->state));

    return 0;
}